

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::SetDeltaZ(RelativeWorldCoordinates *this,KFIXED16_3 *Z)

{
  DataTypeBase local_28;
  short local_20;
  KFIXED<short,_(unsigned_char)__x03_> local_18;
  
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00311e18;
  local_20 = Z->m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_18,&this->m_DelZ);
  DataTypeBase::~DataTypeBase(&local_18.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_28);
  return;
}

Assistant:

RelativeWorldCoordinates::~RelativeWorldCoordinates ()
{
}